

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  uint size_00;
  pointer pcVar1;
  pointer ppFVar2;
  FileDescriptorProto *other;
  long lVar3;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_8_1_a8a14541_for_iterator_2 aVar4;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_00;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  Rep *pRVar10;
  undefined8 *puVar11;
  FileDescriptor *pFVar12;
  FileDescriptorProto *this_01;
  size_t sVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *pVVar14;
  long *plVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_02;
  ulong uVar17;
  Arena *pAVar18;
  undefined1 *puVar19;
  ulong uVar20;
  anon_union_8_1_a8a14541_for_iterator_2 aVar21;
  RepeatedPtrFieldBase *pRVar22;
  pointer __old_p;
  string *program;
  anon_union_8_1_a8a14541_for_iterator_2 *this_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *eq;
  pointer ppFVar23;
  RepeatedPtrFieldBase *this_04;
  bool bVar24;
  iterator iVar25;
  string_view name;
  string_view value;
  string_view format;
  string_view format_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  Subprocess subprocess;
  int size;
  string communicate_error;
  string processed_parameter;
  void *data;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  CodeGeneratorResponse response;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_to_generate;
  CodeGeneratorRequest request;
  anon_union_8_1_a8a14541_for_iterator_2 local_218;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_210;
  char *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_200;
  char *local_1f8 [2];
  long *local_1e8;
  undefined2 local_1e0;
  byte local_1de;
  undefined1 local_1dd;
  anon_union_8_1_a8a14541_for_iterator_2 local_1d8;
  undefined8 local_1d0;
  string *local_1c0;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_1b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b0;
  uint local_1a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  GeneratorContext *local_180;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148;
  undefined7 uStack_147;
  DescriptorPool *local_130;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_128;
  undefined1 local_108 [72];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  undefined1 local_a0 [48];
  RepeatedPtrFieldBase local_70;
  RepeatedPtrFieldBase local_58;
  ArenaStringPtr local_40 [2];
  long *plVar16;
  
  local_1c0 = error;
  local_1b8 = parsed_files;
  local_180 = generator_context;
  CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)local_a0,(Arena *)0x0);
  CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)local_108,(Arena *)0x0);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  pcVar1 = (parameter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,pcVar1 + parameter->_M_string_length);
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       local_178._M_string_length;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
       (size_t)local_178._M_dataplus._M_p;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0] = ',';
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_218,
               (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)&local_c0,
               (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_128);
  aVar4 = aStack_210;
  aVar21 = local_218;
  bVar24 = local_218.slot_ != aStack_210.slot_;
  if (bVar24) {
    iVar7 = std::__cxx11::string::compare((char *)local_218.slot_);
    while (iVar7 != 0) {
      aVar21.slot_ = (slot_type *)((long)aVar21.slot_ + 0x20);
      bVar24 = aVar21.slot_ != aVar4.slot_;
      if (aVar21.slot_ == aVar4.slot_) break;
      iVar7 = std::__cxx11::string::compare((char *)aVar21.slot_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_218);
  if (local_178._M_string_length != 0) {
    local_a0[0x10] = local_a0[0x10] | 1;
    pAVar18 = (Arena *)local_a0._8_8_;
    if ((local_a0._8_8_ & 1) != 0) {
      pAVar18 = *(Arena **)(local_a0._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>(local_40,&local_178,pAVar18);
  }
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  ppFVar23 = (local_1b8->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (local_1b8->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar23 != ppFVar2) {
    do {
      pFVar12 = *ppFVar23;
      pcVar1 = (pFVar12->name_->_M_dataplus)._M_p;
      pvVar9 = protobuf::internal::RepeatedPtrFieldBase::AddString
                         ((RepeatedPtrFieldBase *)(local_a0 + 0x18));
      std::__cxx11::string::_M_replace((ulong)pvVar9,0,*(char **)((long)pvVar9 + 8),(ulong)pcVar1);
      local_218._0_3_ = 0x10101;
      GetTransitiveDependencies
                (this,pFVar12,
                 (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_128,(RepeatedPtrField<google::protobuf::FileDescriptorProto> *)&local_70,
                 (TransitiveDependencyOptions *)&local_218);
      ppFVar23 = ppFVar23 + 1;
    } while (ppFVar23 != ppFVar2);
  }
  if ((local_1b8->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_1b8->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0xafb,"!parsed_files.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_218);
  }
  local_130 = (*(local_1b8->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start)->pool_;
  eq = &local_1a0;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::
  raw_hash_set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)&local_c0,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0,(hasher *)&local_218,
             (key_equal *)eq->_M_local_buf,(allocator_type *)local_158._M_local_buf);
  if ((GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
       ::builtin_plugins_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                                   ::builtin_plugins_abi_cxx11_), iVar7 != 0)) {
    this_02 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)operator_new(0x20);
    local_208 = "protoc-gen-mutable_java";
    paStack_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x12b5834;
    local_218.slot_ = (slot_type *)0x12b57fd;
    aStack_210.slot_ = (slot_type *)0x12b580c;
    eq = &local_158;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
    ::raw_hash_set<char_const*const*>
              (this_02,(char **)&local_218.slot_,local_1f8,0,(hasher *)local_1a0._M_local_buf,
               (key_equal *)eq->_M_local_buf,(allocator_type *)&local_1b0);
    GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
    ::builtin_plugins_abi_cxx11_ =
         (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_02;
    __cxa_guard_release(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                         ::builtin_plugins_abi_cxx11_);
  }
  this_04 = &local_70;
  pRVar22 = this_04;
  if ((local_70.tagged_rep_or_elem_._0_1_ & 1) != 0) {
    pRVar10 = protobuf::internal::RepeatedPtrFieldBase::rep(this_04);
    pRVar22 = (RepeatedPtrFieldBase *)pRVar10->elements;
  }
  if ((local_70.tagged_rep_or_elem_._0_1_ & 1) != 0) {
    pRVar10 = protobuf::internal::RepeatedPtrFieldBase::rep(this_04);
    this_04 = (RepeatedPtrFieldBase *)pRVar10->elements;
  }
  for (; pRVar22 != (RepeatedPtrFieldBase *)(&this_04->tagged_rep_or_elem_ + local_70.current_size_)
      ; pRVar22 = (RepeatedPtrFieldBase *)&pRVar22->current_size_) {
    other = (FileDescriptorProto *)pRVar22->tagged_rep_or_elem_;
    iVar25 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                         *)&local_c0,
                        (key_arg<std::__cxx11::basic_string<char>_> *)
                        ((ulong)(other->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity(&local_c0);
    if (iVar25.ctrl_ != (ctrl_t *)0x0) {
      puVar11 = (undefined8 *)
                ((ulong)(other->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      name._M_str = (char *)*puVar11;
      name._M_len = puVar11[1];
      pFVar12 = DescriptorPool::FindFileByName(local_130,name);
      this_01 = (FileDescriptorProto *)
                protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                          (&local_58,Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>)
      ;
      if (this_01 != other) {
        uVar17 = (this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if ((uVar17 & 1) != 0) {
          uVar17 = *(ulong *)(uVar17 & 0xfffffffffffffffe);
        }
        uVar20 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if ((uVar20 & 1) != 0) {
          uVar20 = *(ulong *)(uVar20 & 0xfffffffffffffffe);
        }
        if (uVar17 == uVar20) {
          FileDescriptorProto::InternalSwap(this_01,other);
        }
        else {
          FileDescriptorProto::CopyFrom(this_01,other);
        }
      }
      FileDescriptor::CopyTo(pFVar12,other);
      if (!bVar24) {
        FileDescriptor::CopySourceCodeInfoTo(pFVar12,other);
        this_00 = GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                  ::builtin_plugins_abi_cxx11_;
        iVar25 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                 ::find<std::__cxx11::string>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                             *)GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                               ::builtin_plugins_abi_cxx11_,plugin_name);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::AssertNotDebugCapacity
                  (&this_00->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        if (iVar25.ctrl_ == (ctrl_t *)0x0) {
          FileDescriptor::CopyJsonNameTo(pFVar12,other);
        }
      }
      StripSourceRetentionOptions(pFVar12->pool_,other);
    }
  }
  local_a0[0x10] = local_a0[0x10] | 2;
  if (local_40[1].tagged_ptr_.ptr_ == (void *)0x0) {
    if ((local_a0._8_8_ & 1) != 0) {
      local_a0._8_8_ = *(undefined8 *)(local_a0._8_8_ & 0xfffffffffffffffe);
    }
    local_40[1].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<google::protobuf::compiler::Version>((Arena *)local_a0._8_8_);
  }
  *(undefined8 *)((long)((long)local_40[1].tagged_ptr_.ptr_ + 0x10) + 0x10) = 0x1f00000006;
  (((anon_union_32_1_493b367e_for_Version_3 *)((long)local_40[1].tagged_ptr_.ptr_ + 0x10))->_impl_).
  patch_ = 0;
  *(byte *)((long)local_40[1].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_40[1].tagged_ptr_.ptr_ + 0x10) | 0xf;
  pAVar18 = (Arena *)(((Message *)local_40[1].tagged_ptr_.ptr_)->super_MessageLite).
                     _internal_metadata_.ptr_;
  if (((ulong)pAVar18 & 1) != 0) {
    pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
  }
  value._M_str = "-dev";
  value._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set
            (&(((anon_union_32_1_493b367e_for_Version_3 *)
               ((long)local_40[1].tagged_ptr_.ptr_ + 0x10))->_impl_).suffix_,value,pAVar18);
  Subprocess::Subprocess((Subprocess *)&local_1b0);
  sVar13 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->plugins_,plugin_name);
  program = plugin_name;
  if (sVar13 != 0) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_218,
               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->plugins_,plugin_name);
    program = (string *)((long)aStack_210.slot_ + 0x20);
  }
  Subprocess::Start((Subprocess *)&local_1b0,program,(uint)(sVar13 != 0));
  local_1a0._M_allocated_capacity = (size_type)&local_190;
  local_1a0._8_8_ = (char *)0x0;
  local_190._M_local_buf[0] = '\0';
  this_03 = &local_1b0;
  bVar24 = Subprocess::Communicate
                     ((Subprocess *)this_03,(Message *)local_a0,(Message *)local_108,
                      (string *)&local_1a0);
  if (bVar24) {
    iVar7 = 0;
    if ((int)local_108._32_4_ < 1) {
      plVar16 = (long *)0x0;
    }
    else {
      plVar16 = (long *)0x0;
      do {
        pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                            ((RepeatedPtrFieldBase *)(local_108 + 0x18),iVar7);
        if (*(long *)(((ulong)(pVVar14->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                      0xfffffffffffffffc) + 8) == 0) {
          if (*(long *)(((ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8) == 0) {
            if (plVar16 == (long *)0x0) {
              local_158._8_8_ = (plugin_name->_M_dataplus)._M_p;
              local_158._M_allocated_capacity = plugin_name->_M_string_length;
              aStack_210.slot_ = (slot_type *)0x0;
              local_208 = (char *)((ulong)local_208 & 0xffffffffffffff00);
              format_00._M_str = (char *)&local_158;
              format_00._M_len =
                   (size_t)"$0: First file chunk returned by plugin did not specify a file name.";
              local_218.slot_ = (slot_type *)&local_208;
              absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                        ((substitute_internal *)&local_218,(Nonnull<std::string_*>)&DAT_00000044,
                         format_00,(Nullable<const_absl::string_view_*>)0x1,(size_t)eq);
              std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_218);
              if (local_218.slot_ != (slot_type *)&local_208) {
                operator_delete(local_218.slot_,(ulong)(local_208 + 1));
              }
              goto LAB_00d83372;
            }
          }
          else {
            if (plVar16 != (long *)0x0) {
              (**(code **)(*plVar16 + 8))(plVar16);
            }
            iVar8 = (*local_180->_vptr_GeneratorContext[2])
                              (local_180,
                               (ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc);
            plVar16 = (long *)CONCAT44(extraout_var_00,iVar8);
          }
        }
        else {
          plVar15 = (long *)((ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc);
          lVar3 = *plVar15;
          local_218.slot_ = (slot_type *)&local_208;
          std::__cxx11::string::_M_construct<char*>((string *)&local_218,lVar3,plVar15[1] + lVar3);
          if (plVar16 != (long *)0x0) {
            (**(code **)(*plVar16 + 8))(plVar16);
          }
          puVar19 = (undefined1 *)(pVVar14->field_0)._impl_.generated_code_info_;
          if ((GeneratedCodeInfo *)puVar19 == (GeneratedCodeInfo *)0x0) {
            puVar19 = _GeneratedCodeInfo_default_instance_;
          }
          iVar8 = (*local_180->_vptr_GeneratorContext[5])
                            (local_180,&local_218,
                             (ulong)(pVVar14->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc,puVar19);
          plVar16 = (long *)CONCAT44(extraout_var,iVar8);
          if (local_218.slot_ != (slot_type *)&local_208) {
            operator_delete(local_218.slot_,(ulong)(local_208 + 1));
          }
        }
        local_1de = io::CodedOutputStream::default_serialization_deterministic_ & 1;
        local_1e0 = 0;
        local_1dd = 0;
        local_218.slot_ = (slot_type *)&local_208;
        aStack_210.slot_ = (slot_type *)&local_208;
        local_1e8 = plVar16;
        local_1d8.slot_ = (slot_type *)&local_208;
        local_1d0 = (**(code **)(*plVar16 + 0x20))(plVar16);
        bVar5 = (**(code **)(*plVar16 + 0x10))(plVar16,&local_158,&local_1a4);
        if ((bVar5 & 0 < (int)local_1a4) == 1) {
          aVar21.slot_ = (slot_type *)(local_158._M_allocated_capacity - 0x10);
          if ((int)local_1a4 < 0x11) {
            aVar21.slot_ = (slot_type *)&local_208;
          }
          local_218.slot_ = (slot_type *)((long)aVar21.slot_ + (ulong)local_1a4);
          aStack_210.slot_ = (slot_type *)0x0;
          local_1d8 = (anon_union_8_1_a8a14541_for_iterator_2)local_158._M_allocated_capacity;
          if ((int)local_1a4 < 0x11) {
            aStack_210 = (anon_union_8_1_a8a14541_for_iterator_2)local_158._M_allocated_capacity;
            local_1d8.slot_ = (slot_type *)&local_208;
          }
        }
        aVar21 = local_1d8;
        puVar11 = (undefined8 *)
                  ((ulong)(pVVar14->field_0)._impl_.content_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        pvVar9 = (void *)*puVar11;
        size_00 = *(uint *)(puVar11 + 1);
        if ((long)local_218.slot_ - (long)local_1d8 < (long)(int)size_00) {
          local_1d8.slot_ =
               (slot_type *)
               io::EpsCopyOutputStream::WriteRawFallback
                         ((EpsCopyOutputStream *)&local_218,pvVar9,size_00,
                          (uint8_t *)local_1d8.slot_);
        }
        else {
          memcpy(local_1d8.slot_,pvVar9,(ulong)size_00);
          local_1d8.slot_ = (slot_type *)((long)(int)size_00 + (long)aVar21.slot_);
        }
        this_03 = &local_218;
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_218);
        iVar7 = iVar7 + 1;
      } while (iVar7 < (int)local_108._32_4_);
    }
    parsed_files_00 = local_1b8;
    bVar24 = EnforceProto3OptionalSupport
                       ((CommandLineInterface *)this_03,plugin_name,local_108._56_8_,local_1b8);
    bVar6 = EnforceEditionsSupport
                      (this,plugin_name,local_108._56_8_,local_108._64_4_,local_108._68_4_,
                       parsed_files_00);
    if (*(long *)((local_108._48_8_ & 0xfffffffffffffffc) + 8) == 0) {
      bVar24 = bVar24 && bVar6;
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_1c0);
LAB_00d83372:
      bVar24 = false;
    }
    if (plVar16 != (long *)0x0) {
      (**(code **)(*plVar16 + 8))(plVar16);
    }
  }
  else {
    aStack_210 = (anon_union_8_1_a8a14541_for_iterator_2)(plugin_name->_M_dataplus)._M_p;
    local_218 = (anon_union_8_1_a8a14541_for_iterator_2)plugin_name->_M_string_length;
    local_158._8_8_ = 0;
    local_148 = 0;
    local_208 = (char *)local_1a0._8_8_;
    paStack_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_allocated_capacity;
    format._M_str = (char *)&local_218;
    format._M_len = (size_t)"$0: $1";
    local_158._M_allocated_capacity = (size_type)(slot_type *)&local_148;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_158._M_local_buf,(Nonnull<std::string_*>)&DAT_00000006,
               format,(Nullable<const_absl::string_view_*>)0x2,(size_t)eq);
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_158._M_local_buf);
    if ((slot_type *)local_158._M_allocated_capacity != (slot_type *)&local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,CONCAT71(uStack_147,local_148) + 1);
    }
    bVar24 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_allocated_capacity != &local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity,
                    CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1);
  }
  Subprocess::~Subprocess((Subprocess *)&local_1b0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_c0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::destructor_impl(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)local_108);
  CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)local_a0);
  return bVar24;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;

  bool bootstrap = GetBootstrapParam(processed_parameter);

  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  absl::flat_hash_set<const FileDescriptor*> already_seen;
  for (const FileDescriptor* file : parsed_files) {
    request.add_file_to_generate(file->name());
    GetTransitiveDependencies(file, &already_seen, request.mutable_proto_file(),
                              {/*.include_json_name =*/true,
                               /*.include_source_code_info =*/true,
                               /*.retain_options =*/true});
  }

  // Populate source_file_descriptors and remove source-retention options from
  // proto_file.
  ABSL_CHECK(!parsed_files.empty());
  const DescriptorPool* pool = parsed_files[0]->pool();
  absl::flat_hash_set<std::string> files_to_generate(input_files_.begin(),
                                                     input_files_.end());
  static const auto builtin_plugins = new absl::flat_hash_set<std::string>(
      {"protoc-gen-cpp", "protoc-gen-java", "protoc-gen-mutable_java",
       "protoc-gen-python"});
  for (FileDescriptorProto& file_proto : *request.mutable_proto_file()) {
    if (files_to_generate.contains(file_proto.name())) {
      const FileDescriptor* file = pool->FindFileByName(file_proto.name());
      *request.add_source_file_descriptors() = std::move(file_proto);
      file->CopyTo(&file_proto);
      // Don't populate source code info or json_name for bootstrap protos.
      if (!bootstrap) {
        file->CopySourceCodeInfoTo(&file_proto);

        // The built-in code generators didn't use the json names.
        if (!builtin_plugins->contains(plugin_name)) {
          file->CopyJsonNameTo(&file_proto);
        }
      }
      StripSourceRetentionOptions(*file->pool(), file_proto);
    }
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = absl::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); ++i) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(
          generator_context->OpenForInsertWithGeneratedCodeInfo(
              filename, output_file.insertion_point(),
              output_file.generated_code_info()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == nullptr) {
      *error = absl::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  bool success = true;
  if (!EnforceProto3OptionalSupport(plugin_name, response.supported_features(),
                                    parsed_files)) {
    success = false;
  }
  if (!EnforceEditionsSupport(plugin_name, response.supported_features(),
                              static_cast<Edition>(response.minimum_edition()),
                              static_cast<Edition>(response.maximum_edition()),
                              parsed_files)) {
    success = false;
  }
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    success = false;
  }

  return success;
}